

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
::_update_barcode(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
                  *this,Pos_index birth)

{
  Pos_index PVar1;
  Pos_index *pPVar2;
  Barcode *this_00;
  Bar_dictionary *pBVar3;
  reference pvVar4;
  reference pvVar5;
  Bar_dictionary *this_01;
  Pos_index birth_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
  *this_local;
  
  pPVar2 = _nextPosition(this);
  PVar1 = *pPVar2;
  this_00 = _barcode(this);
  pBVar3 = _indexToBar(this);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pBVar3,(ulong)birth)
  ;
  pvVar5 = std::
           vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ::operator[](this_00,(ulong)*pvVar4);
  pvVar5->death = PVar1;
  pBVar3 = _indexToBar(this);
  this_01 = _indexToBar(this);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_01,(ulong)birth);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pBVar3,pvVar4);
  pPVar2 = _nextPosition(this);
  *pPVar2 = *pPVar2 + 1;
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_update_barcode(Pos_index birth)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_removable_columns) {
      auto& barIt = _indexToBar().at(birth);
      barIt->death = _nextPosition();
      _indexToBar().try_emplace(_nextPosition(), barIt);  // list so iterators are stable
    } else {
      _barcode()[_indexToBar()[birth]].death = _nextPosition();
      _indexToBar().push_back(_indexToBar()[birth]);
    }
    ++_nextPosition();
  }
}